

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Ptr<Catch::IStreamingReporter> __thiscall
Catch::addListeners(Catch *this,Ptr<const_Catch::IConfig> *config,
                   Ptr<Catch::IStreamingReporter> *reporters)

{
  IReporterFactory *pIVar1;
  NonCopyable NVar2;
  Catch *pCVar3;
  int iVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *__x;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pPVar6;
  Listeners listeners;
  Ptr<Catch::IStreamingReporter> local_70;
  long *local_68;
  undefined8 local_60;
  IConfig *local_58;
  Catch *local_50;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  local_48;
  
  local_50 = this;
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[2])(pIVar5);
  __x = (vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
         *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                     ((long *)CONCAT44(extraout_var,iVar4));
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::vector(&local_48,__x);
  if (local_48.
      super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pPVar6 = local_48.
             super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pIVar1 = pPVar6->m_p;
      iVar4 = (*(config->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[5])();
      local_60 = CONCAT44(extraout_var_00,iVar4);
      local_58 = config->m_p;
      if (local_58 != (IConfig *)0x0) {
        (*(local_58->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
      }
      iVar4 = (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[4])(pIVar1,&local_60);
      local_70.m_p = (IStreamingReporter *)CONCAT44(extraout_var_01,iVar4);
      if (local_70.m_p != (IStreamingReporter *)0x0) {
        (*((local_70.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(local_70.m_p);
      }
      addReporter((Catch *)&local_68,reporters,&local_70);
      Ptr<Catch::IStreamingReporter>::operator=
                (reporters,(Ptr<Catch::IStreamingReporter> *)&local_68);
      if (local_68 != (long *)0x0) {
        (**(code **)(*local_68 + 0x18))();
      }
      if (local_70.m_p != (IStreamingReporter *)0x0) {
        (*((local_70.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
      }
      if (local_58 != (IConfig *)0x0) {
        (*(local_58->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
      }
      pPVar6 = pPVar6 + 1;
    } while (pPVar6 != local_48.
                       super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pCVar3 = local_50;
  NVar2._vptr_NonCopyable = (_func_int **)reporters->m_p;
  *(_func_int ***)local_50 = NVar2._vptr_NonCopyable;
  if ((NonCopyable)NVar2._vptr_NonCopyable != (NonCopyable)0x0) {
    (**(code **)(*NVar2._vptr_NonCopyable + 0x10))();
  }
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::~vector(&local_48);
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)pCVar3;
}

Assistant:

Ptr<IStreamingReporter> addListeners( Ptr<IConfig const> const& config, Ptr<IStreamingReporter> reporters ) {
        IReporterRegistry::Listeners listeners = getRegistryHub().getReporterRegistry().getListeners();
        for( IReporterRegistry::Listeners::const_iterator it = listeners.begin(), itEnd = listeners.end();
                it != itEnd;
                ++it )
            reporters = addReporter(reporters, (*it)->create( ReporterConfig( config ) ) );
        return reporters;
    }